

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O2

CURLproxycode
socks_state_recv(Curl_cfilter *cf,socks_state *sx,Curl_easy *data,CURLproxycode failcode,
                char *description)

{
  undefined8 in_RAX;
  ssize_t sVar1;
  char *pcVar2;
  CURLcode result;
  
  result = (CURLcode)((ulong)in_RAX >> 0x20);
  sVar1 = Curl_conn_cf_recv(cf->next,data,(char *)sx->outp,sx->outstanding,&result);
  if (sVar1 < 1) {
    if (result != CURLE_AGAIN) {
      if (result == CURLE_OK) {
        Curl_failf(data,"connection to proxy closed");
        return CURLPX_CLOSED;
      }
      pcVar2 = curl_easy_strerror(result);
      Curl_failf(data,"SOCKS: Failed receiving %s: %s",description,pcVar2);
      return failcode;
    }
  }
  else {
    sx->outstanding = sx->outstanding - sVar1;
    sx->outp = sx->outp + sVar1;
  }
  return CURLPX_OK;
}

Assistant:

static CURLproxycode socks_state_recv(struct Curl_cfilter *cf,
                                      struct socks_state *sx,
                                      struct Curl_easy *data,
                                      CURLproxycode failcode,
                                      const char *description)
{
  ssize_t nread;
  CURLcode result;

  nread = Curl_conn_cf_recv(cf->next, data, (char *)sx->outp,
                            sx->outstanding, &result);
  if(nread <= 0) {
    if(CURLE_AGAIN == result) {
      return CURLPX_OK;
    }
    else if(CURLE_OK == result) {
      /* connection closed */
      failf(data, "connection to proxy closed");
      return CURLPX_CLOSED;
    }
    failf(data, "SOCKS: Failed receiving %s: %s", description,
          curl_easy_strerror(result));
    return failcode;
  }
  /* remain in reading state */
  DEBUGASSERT(sx->outstanding >= nread);
  sx->outstanding -= nread;
  sx->outp += nread;
  return CURLPX_OK;
}